

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O1

int event_callback_activate_nolock_(event_base *base,event_callback *evcb)

{
  byte *pbVar1;
  byte bVar2;
  uint8_t uVar3;
  ushort uVar4;
  unsigned_long uVar5;
  code *pcVar6;
  event_callback *peVar7;
  long lVar8;
  short sVar9;
  int iVar10;
  int extraout_EAX;
  uint uVar11;
  unsigned_long uVar12;
  ulong uVar13;
  _func_void_int_short_void_ptr *p_Var14;
  uint uVar15;
  uint *puVar16;
  char *pcVar17;
  event_callback *in_RDX;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  char *pcVar18;
  void *extraout_RDX_03;
  void *extraout_RDX_04;
  void *pvVar19;
  long lVar20;
  ulong uVar21;
  int iVar22;
  event_base *ev;
  undefined1 *puVar23;
  short unaff_BP;
  eventop *peVar24;
  long lVar25;
  long lVar26;
  char *pcVar27;
  _func_void_int_short_void_ptr *unaff_R12;
  timeval *ptVar28;
  long unaff_R13;
  event_base *peVar29;
  bool bVar30;
  
  puVar23 = &stack0xffffffffffffffe8;
  ev = (event_base *)0x0;
  iVar22 = 0;
  if ((evcb->evcb_flags & 0x40U) != 0) {
    std::_Sp_counted_ptr<ot::commissioner::SysLogger*,(__gnu_cxx::_Lock_policy)2>::typeinfo_name
    [0x1b] = 'c';
    ram0x00274ddf = 0xfdc6bcff;
    return 0;
  }
  puVar16 = &switchD_0025149a::switchdataD_00274de0;
  peVar29 = base;
  switch((ushort)evcb->evcb_flags >> 3 & 5) {
  case 0:
    iVar22 = 1;
    break;
  case 1:
    goto switchD_0025149a_caseD_1;
  default:
    pvVar19 = base->th_base_lock;
    if (pvVar19 != (void *)0x0) {
      (*evthread_lock_fns_.lock)(0,pvVar19);
    }
    event_callback_finalize_nolock_
              (base,(uint)pvVar19,in_RDX,
               (_func_void_event_callback_ptr_void_ptr *)&switchD_0025149a::switchdataD_00274de0);
    if (base->th_base_lock != (void *)0x0) {
      iVar22 = (*evthread_lock_fns_.unlock)(0,base->th_base_lock);
      return iVar22;
    }
    return extraout_EAX;
  case 4:
    event_queue_remove_active_later(base,evcb);
    iVar22 = 0;
    break;
  case 5:
    goto switchD_0025149a_caseD_5;
  case 6:
    unique0x00006b00 = 0xfdc6bd00;
    puVar23 = &stack0xffffffffffffffe0;
    std::_Sp_counted_ptr<ot::commissioner::SysLogger*,(__gnu_cxx::_Lock_policy)2>::typeinfo_name
    [0x1b] = '`';
    peVar24 = (eventop *)evcb;
code_r0x00253022:
    pbVar1 = (byte *)((long)puVar16 * 5 + -0x19);
    *pbVar1 = *pbVar1 & (byte)puVar16;
    *(undefined8 *)(puVar23 + -8) = 0x253028;
    (*(code *)ev)(base,peVar24);
LAB_002531f6:
    if (evcb[10].evcb_arg != (void *)0x0) {
      pcVar6 = *(code **)(unaff_R13 + 0x18);
      *(undefined8 *)(puVar23 + -8) = 0x253208;
      (*pcVar6)(0);
    }
    evcb[0xb].evcb_flags = 0;
    evcb[0xb].evcb_pri = '\0';
    evcb[0xb].evcb_closure = '\0';
    *(undefined4 *)&evcb[0xb].field_0x14 = 0;
    if (*(int *)&evcb[0xb].evcb_active_next.tqe_prev != 0) {
      *(undefined4 *)&evcb[0xb].evcb_active_next.tqe_prev = 0;
      peVar7 = evcb[0xb].evcb_active_next.tqe_next;
      if (peVar7 != (event_callback *)0x0) {
        *(undefined8 *)(puVar23 + -8) = 0x253243;
        (*evthread_cond_fns_.signal_condition)(peVar7,1);
      }
    }
    iVar22 = 1;
    iVar10 = (int)peVar29;
    if (*(int *)((long)&evcb[5].evcb_cb_union + 4) == 0) {
      if (iVar10 < *(int *)(puVar23 + 0x34)) {
        if ((*(long *)(puVar23 + 0x38) != 0) && (iVar10 != 0)) {
          evcb[8].evcb_cb_union.evcb_callback = (_func_void_int_short_void_ptr *)0x0;
          if (((ulong)evcb[0xb].evcb_cb_union & 8) == 0) {
            *(undefined8 *)(puVar23 + -8) = 0x253295;
            gettime((event_base *)evcb,*(timeval **)(puVar23 + 0x40));
          }
          *(undefined8 *)(puVar23 + -8) = 0x2532a2;
          gettime((event_base *)evcb,(timeval *)(puVar23 + 8));
          lVar25 = **(long **)(puVar23 + 0x38);
          if (*(long *)(puVar23 + 8) == lVar25) {
            if ((*(long **)(puVar23 + 0x38))[1] <= *(long *)(puVar23 + 0x10)) goto LAB_002532bf;
LAB_002532d1:
            bVar30 = true;
          }
          else {
            if (*(long *)(puVar23 + 8) < lVar25) goto LAB_002532d1;
LAB_002532bf:
            bVar30 = false;
            *(int *)(puVar23 + 0x1c) = iVar10;
          }
          if (!bVar30) goto LAB_002532e7;
        }
        iVar22 = (uint)(*(int *)&evcb[5].evcb_arg != 0) << 2;
      }
      else {
        *(int *)(puVar23 + 0x1c) = iVar10;
      }
    }
    else {
      *(undefined4 *)(puVar23 + 0x1c) = 0xffffffff;
    }
LAB_002532e7:
    if (iVar22 != 0) {
      if (iVar22 == 4) {
        return iVar10;
      }
      return *(int *)(puVar23 + 0x1c);
    }
    base = (event_base *)**(undefined8 **)(puVar23 + 0x50);
    if (base == (event_base *)0x0) {
      return iVar10;
    }
    uVar4 = *(ushort *)&(base->changelist).changes;
    if ((char)uVar4 < '\0') {
      if ((uVar4 & 0x40) == 0 &&
          (*(ushort *)((anon_union_16_2_9ce1ef8e_for_ev_timeout_pos *)&base->sig + 4) & 0x10) == 0)
      {
        *(undefined8 *)(puVar23 + -8) = 0x252e42;
        event_del_nolock_((event *)base,0);
        pvVar19 = extraout_RDX_02;
      }
      else {
        *(undefined8 *)(puVar23 + -8) = 0x252e36;
        event_queue_remove_active((event_base *)evcb,(event_callback *)base);
        pvVar19 = extraout_RDX_01;
      }
      ev = base;
      if (event_debug_logging_mask_ != 0) {
        uVar4 = *(short *)((long)&base->sig + 0x42);
        pcVar18 = "EV_READ ";
        if ((uVar4 & 2) == 0) {
          pcVar18 = " ";
        }
        pcVar17 = "EV_WRITE ";
        if ((uVar4 & 4) == 0) {
          pcVar17 = " ";
        }
        pcVar27 = "EV_CLOSED ";
        if (-1 < (char)uVar4) {
          pcVar27 = " ";
        }
        p_Var14 = ((anon_union_8_4_85009615_for_evcb_cb_union *)&(base->changelist).n_changes)->
                  evcb_callback;
        *(undefined8 *)(puVar23 + -8) = 0x252e9b;
        event_debugx_("event_process_active: event: %p, %s%s%scall %p",base,pcVar18,pcVar17,pcVar27,
                      p_Var14);
        pvVar19 = extraout_RDX_03;
      }
    }
    else {
      *(undefined8 *)(puVar23 + -8) = 0x252deb;
      event_queue_remove_active((event_base *)evcb,(event_callback *)base);
      pvVar19 = extraout_RDX;
      if (event_debug_logging_mask_ != 0) {
        bVar2 = *(uint8_t *)((long)&(base->changelist).changes + 3);
        p_Var14 = ((anon_union_8_4_85009615_for_evcb_cb_union *)&(base->changelist).n_changes)->
                  evcb_callback;
        *(undefined8 *)(puVar23 + -8) = 0x252e13;
        event_debugx_("event_process_active: event_callback %p, closure %d, call %p",base,
                      (ulong)bVar2,p_Var14);
        pvVar19 = extraout_RDX_00;
      }
      ev = (event_base *)0x0;
    }
    peVar29 = (event_base *)
              (ulong)(iVar10 + (uint)(((ulong)(base->changelist).changes & 0x10) == 0));
    *(event_base **)&evcb[0xb].evcb_flags = base;
    *(undefined4 *)&evcb[0xb].evcb_active_next.tqe_prev = 0;
    uVar3 = *(uint8_t *)((long)&(base->changelist).changes + 3);
    puVar16 = &switchD_00252edf::switchdataD_00274df8;
    switch(uVar3) {
    case '\0':
      if (ev != (event_base *)0x0) {
        unaff_R12 = ((anon_union_8_4_85009615_for_evcb_cb_union *)&(ev->changelist).n_changes)->
                    evcb_callback;
        unaff_BP = *(short *)((long)&ev->sig + 0x42);
        if (evcb[10].evcb_arg != (void *)0x0) {
switchD_0025149a_caseD_7:
          pcVar6 = *(code **)(unaff_R13 + 0x20);
          *(undefined8 *)(puVar23 + -8) = 0x253050;
          (*pcVar6)(0);
        }
        iVar22 = ((anon_union_16_2_9ce1ef8e_for_ev_timeout_pos *)&ev->sig)[1].min_heap_idx;
        peVar24 = ev->evsigsel;
        *(undefined8 *)(puVar23 + -8) = 0x25305d;
        (*unaff_R12)(iVar22,unaff_BP,peVar24);
        goto LAB_002531f6;
      }
      break;
    case '\x01':
      if (ev != (event_base *)0x0) {
        sVar9 = *(short *)((anon_union_16_2_9ce1ef8e_for_ev_timeout_pos *)&ev->sig + 3);
        *(short *)(puVar23 + 8) = sVar9;
        if (sVar9 != 0) {
          *(undefined1 **)((long)&ev->sig + 0x38) = puVar23 + 8;
        }
        if (evcb[10].evcb_arg != (void *)0x0) {
          pcVar6 = *(code **)(unaff_R13 + 0x20);
          *(undefined8 *)(puVar23 + -8) = 0x253094;
          (*pcVar6)();
        }
        do {
          if (*(short *)(puVar23 + 8) == 0) goto LAB_002531f6;
          sVar9 = *(short *)(puVar23 + 8) + -1;
          *(short *)(puVar23 + 8) = sVar9;
          *(short *)((anon_union_16_2_9ce1ef8e_for_ev_timeout_pos *)&ev->sig + 3) = sVar9;
          if (sVar9 == 0) {
            *(undefined8 *)((long)&ev->sig + 0x38) = 0;
          }
          iVar22 = ((anon_union_16_2_9ce1ef8e_for_ev_timeout_pos *)&ev->sig)[1].min_heap_idx;
          sVar9 = *(short *)((long)&ev->sig + 0x42);
          peVar24 = ev->evsigsel;
          p_Var14 = ((anon_union_8_4_85009615_for_evcb_cb_union *)&(ev->changelist).n_changes)->
                    evcb_callback;
          *(undefined8 *)(puVar23 + -8) = 0x2530c6;
          (*p_Var14)(iVar22,sVar9,peVar24);
          if (evcb[10].evcb_arg != (void *)0x0) {
            pcVar6 = *(code **)(unaff_R13 + 0x18);
            *(undefined8 *)(puVar23 + -8) = 0x2530d8;
            (*pcVar6)();
          }
          iVar22 = *(int *)((long)&evcb[5].evcb_cb_union + 4);
          if (evcb[10].evcb_arg != (void *)0x0) {
            pcVar6 = *(code **)(unaff_R13 + 0x20);
            *(undefined8 *)(puVar23 + -8) = 0x2530f1;
            (*pcVar6)();
          }
        } while (iVar22 == 0);
        if (*(short *)(puVar23 + 8) != 0) {
          *(undefined8 *)((long)&ev->sig + 0x38) = 0;
        }
        goto LAB_002531f6;
      }
LAB_00253321:
      *(undefined8 *)(puVar23 + -8) = 0x253326;
      event_process_active_single_queue_cold_7();
      break;
    case '\x02':
      if (ev == (event_base *)0x0) goto LAB_00253330;
      if ((*(long *)&((anon_union_16_2_9ce1ef8e_for_ev_timeout_pos *)&ev->sig)[3].
                     ev_next_with_common_timeout != 0) || (*(long *)((long)&ev->sig + 0x38) != 0)) {
        if ((*(ulong *)((long)&ev->sig + 0x38) ^
            *(ulong *)&((anon_union_16_2_9ce1ef8e_for_ev_timeout_pos *)&ev->sig)[5].
                       ev_next_with_common_timeout) < 0x100000) {
          ptVar28 = (timeval *)((long)&ev->sig + 0x48);
          *(undefined8 *)(puVar23 + -8) = 0x252fae;
          gettime((event_base *)evcb,(timeval *)(puVar23 + 0x20));
          uVar21 = *(ulong *)&((anon_union_16_2_9ce1ef8e_for_ev_timeout_pos *)&ev->sig)[5].
                              ev_next_with_common_timeout;
          if ((((uint)uVar21 & 0xf0000000) == 0x50000000) &&
             ((int)((uint)(uVar21 >> 0x14) & 0xff) < *(int *)&evcb[7].evcb_active_next.tqe_prev)) {
            lVar25 = *(long *)&((anon_union_16_2_9ce1ef8e_for_ev_timeout_pos *)&ev->sig)[3].
                               ev_next_with_common_timeout;
            uVar11 = (uint)*(undefined8 *)((long)&ev->sig + 0x38);
            uVar15 = uVar11 & 0xfff00000;
            uVar13 = (ulong)(uVar11 & 0xfffff);
            if ((*(byte *)((long)&ev->sig + 0x42) & 1) == 0) {
              uVar21 = *(ulong *)(puVar23 + 0x28);
              ptVar28 = (timeval *)(puVar23 + 0x20);
            }
            else {
              uVar21 = (ulong)((uint)uVar21 & 0xfffff);
            }
          }
          else {
            bVar30 = (*(byte *)((long)&ev->sig + 0x42) & 1) == 0;
            lVar25 = *(long *)&((anon_union_16_2_9ce1ef8e_for_ev_timeout_pos *)&ev->sig)[3].
                               ev_next_with_common_timeout;
            if (bVar30) {
              uVar21 = *(ulong *)(puVar23 + 0x28);
            }
            uVar13 = *(ulong *)((long)&ev->sig + 0x38);
            if (bVar30) {
              ptVar28 = (timeval *)(puVar23 + 0x20);
            }
            uVar15 = 0;
          }
          lVar26 = ptVar28->tv_sec + lVar25;
          *(long *)(puVar23 + 8) = lVar26;
          lVar20 = uVar21 + uVar13;
          *(long *)(puVar23 + 0x10) = lVar20;
          if (999999 < lVar20) {
            *(long *)(puVar23 + 8) = lVar26 + 1;
            *(long *)(puVar23 + 0x10) = lVar20 + -1000000;
          }
          lVar20 = *(long *)(puVar23 + 0x20);
          lVar26 = *(long *)(puVar23 + 8);
          bVar30 = SBORROW8(lVar26,lVar20);
          lVar8 = lVar26 - lVar20;
          if (lVar26 == lVar20) {
            bVar30 = SBORROW8(*(long *)(puVar23 + 0x10),*(long *)(puVar23 + 0x28));
            lVar8 = *(long *)(puVar23 + 0x10) - *(long *)(puVar23 + 0x28);
          }
          if (bVar30 != lVar8 < 0) {
            *(long *)(puVar23 + 8) = lVar20 + lVar25;
            lVar26 = uVar13 + *(long *)(puVar23 + 0x28);
            *(long *)(puVar23 + 0x10) = lVar26;
            if (999999 < lVar26) {
              *(long *)(puVar23 + 8) = lVar20 + lVar25 + 1;
              *(long *)(puVar23 + 0x10) = lVar26 + -1000000;
            }
          }
          *(ulong *)(puVar23 + 0x10) = *(ulong *)(puVar23 + 0x10) | (ulong)uVar15;
          *(undefined8 *)(puVar23 + -8) = 0x2531ba;
          event_add_nolock_((event *)ev,(timeval *)(puVar23 + 8),1);
          goto LAB_002531ba;
        }
        goto LAB_00253335;
      }
LAB_002531ba:
      p_Var14 = ((anon_union_8_4_85009615_for_evcb_cb_union *)&(ev->changelist).n_changes)->
                evcb_callback;
      peVar24 = ev->evsigsel;
      iVar22 = ((anon_union_16_2_9ce1ef8e_for_ev_timeout_pos *)&ev->sig)[1].min_heap_idx;
      sVar9 = *(short *)((long)&ev->sig + 0x42);
      if (evcb[10].evcb_arg != (void *)0x0) {
        *(_func_void_int_short_void_ptr **)(puVar23 + 0x48) = p_Var14;
        pcVar6 = *(code **)(unaff_R13 + 0x20);
        *(undefined8 *)(puVar23 + -8) = 0x2531e0;
        (*pcVar6)(0);
        p_Var14 = *(_func_void_int_short_void_ptr **)(puVar23 + 0x48);
      }
      *(undefined8 *)(puVar23 + -8) = 0x2531ef;
      (*p_Var14)(iVar22,sVar9,peVar24);
      goto LAB_002531f6;
    case '\x03':
      goto switchD_00252edf_caseD_3;
    case '\x04':
      ev = (event_base *)
           ((anon_union_8_4_85009615_for_evcb_cb_union *)&(base->changelist).n_changes)->
           evcb_callback;
      evcb[0xb].evcb_flags = 0;
      evcb[0xb].evcb_pri = '\0';
      evcb[0xb].evcb_closure = '\0';
      *(undefined4 *)&evcb[0xb].field_0x14 = 0;
      if (((ulong)(base->changelist).changes & 0x40) == 0) goto LAB_0025332b;
      goto LAB_0025300c;
    case '\x05':
    case '\x06':
      if (ev == (event_base *)0x0) {
        *(undefined8 *)(puVar23 + -8) = 0x25331c;
        event_process_active_single_queue_cold_3();
LAB_0025331c:
        *(undefined8 *)(puVar23 + -8) = 0x253321;
        event_process_active_single_queue_cold_2();
        goto LAB_00253321;
      }
      evcb[0xb].evcb_flags = 0;
      evcb[0xb].evcb_pri = '\0';
      evcb[0xb].evcb_closure = '\0';
      *(undefined4 *)&evcb[0xb].field_0x14 = 0;
      if (((ulong)(base->changelist).changes & 0x40) == 0) goto LAB_0025331c;
      p_Var14 = ((anon_union_8_4_85009615_for_evcb_cb_union *)&(ev->changelist).n_changes)->
                evcb_callback;
      if (evcb[10].evcb_arg != (void *)0x0) {
        pcVar6 = *(code **)(unaff_R13 + 0x20);
        *(undefined8 *)(puVar23 + -8) = 0x252f17;
        (*pcVar6)(0);
        pvVar19 = extraout_RDX_04;
      }
      peVar24 = ev->evsigsel;
      *(undefined8 *)(puVar23 + -8) = 0x252f21;
      (*p_Var14)((int)ev,(short)peVar24,pvVar19);
      *(undefined8 *)(puVar23 + -8) = 0x252f29;
      event_debug_note_teardown_((event *)ev);
      if (uVar3 == '\x06') {
        if (mm_free_fn_ == (_func_void_void_ptr *)0x0) {
          *(undefined8 *)(puVar23 + -8) = 0x2531f6;
          free(ev);
        }
        else {
          *(undefined8 *)(puVar23 + -8) = 0x252f48;
          (*mm_free_fn_)(ev);
        }
      }
      goto LAB_002531f6;
    default:
      goto switchD_00252edf_default;
    }
    *(undefined8 *)(puVar23 + -8) = 0x25332b;
    event_process_active_single_queue_cold_4();
LAB_0025332b:
    *(undefined8 *)(puVar23 + -8) = 0x253330;
    event_process_active_single_queue_cold_1();
LAB_00253330:
    *(undefined8 *)(puVar23 + -8) = 0x253335;
    event_process_active_single_queue_cold_6();
LAB_00253335:
    *(undefined8 *)(puVar23 + -8) = 0x25333a;
    event_process_active_single_queue_cold_5();
    *(undefined8 *)(puVar23 + -8) = 0x25333f;
    event_process_active_single_queue_cold_8();
switchD_00252edf_default:
    *(code **)(puVar23 + -8) = evthread_notify_base_eventfd;
    event_errx(-0x21522153,"%s:%d: Assertion %s failed in %s",
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/libevent/repo/event.c"
               ,0x6c2,"0","event_process_active_single_queue");
  case 7:
    goto switchD_0025149a_caseD_7;
  }
  if (((base->th_base_lock != (void *)0x0) && (evthread_lock_debugging_enabled_ != 0)) &&
     (iVar10 = evthread_is_debug_lock_held_(base->th_base_lock), iVar10 == 0)) {
    event_callback_activate_nolock__cold_2();
LAB_002515bb:
    event_callback_activate_nolock__cold_1();
switchD_0025149a_caseD_5:
    event_errx(-0x21522153,"%s:%d: Assertion %s failed in %s",
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/libevent/repo/event.c"
               ,0xbcb,"0","event_callback_activate_nolock_");
  }
  if ((evcb->evcb_flags & 8U) == 0) {
    iVar10 = base->event_count + (uint)((evcb->evcb_flags & 0x10U) == 0);
    base->event_count = iVar10;
    if (iVar10 < base->event_count_max) {
      iVar10 = base->event_count_max;
    }
    base->event_count_max = iVar10;
    *(byte *)&evcb->evcb_flags = (byte)evcb->evcb_flags | 8;
    iVar10 = base->event_count_active + 1;
    base->event_count_active = iVar10;
    if (iVar10 < base->event_count_active_max) {
      iVar10 = base->event_count_active_max;
    }
    base->event_count_active_max = iVar10;
    bVar2 = evcb->evcb_pri;
    if (base->nactivequeues <= (int)(uint)bVar2) goto LAB_002515bb;
    (evcb->evcb_active_next).tqe_next = (event_callback *)0x0;
    (evcb->evcb_active_next).tqe_prev = base->activequeues[bVar2].tqh_last;
    *base->activequeues[bVar2].tqh_last = evcb;
    base->activequeues[evcb->evcb_pri].tqh_last = (event_callback **)evcb;
  }
  if (((evthread_id_fn_ != (_func_unsigned_long *)0x0) && (base->running_loop != 0)) &&
     (uVar5 = base->th_owner_id, uVar12 = (*evthread_id_fn_)(), uVar5 != uVar12)) {
    evthread_notify_base(base);
  }
switchD_0025149a_caseD_1:
  return iVar22;
switchD_00252edf_caseD_3:
  ev = (event_base *)
       ((anon_union_8_4_85009615_for_evcb_cb_union *)&(base->changelist).n_changes)->evcb_callback;
LAB_0025300c:
  if (evcb[10].evcb_arg != (void *)0x0) {
    pcVar6 = *(code **)(unaff_R13 + 0x20);
    *(undefined8 *)(puVar23 + -8) = 0x25301e;
    (*pcVar6)(0);
  }
  peVar24 = base->evsigsel;
  goto code_r0x00253022;
}

Assistant:

int
event_callback_activate_nolock_(struct event_base *base,
    struct event_callback *evcb)
{
	int r = 1;

	if (evcb->evcb_flags & EVLIST_FINALIZING)
		return 0;

	switch (evcb->evcb_flags & (EVLIST_ACTIVE|EVLIST_ACTIVE_LATER)) {
	default:
		EVUTIL_ASSERT(0);
		EVUTIL_FALLTHROUGH;
	case EVLIST_ACTIVE_LATER:
		event_queue_remove_active_later(base, evcb);
		r = 0;
		break;
	case EVLIST_ACTIVE:
		return 0;
	case 0:
		break;
	}

	event_queue_insert_active(base, evcb);

	if (EVBASE_NEED_NOTIFY(base))
		evthread_notify_base(base);

	return r;
}